

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

void __thiscall QTextDocument::print(QTextDocument *this,QPagedPaintDevice *printer)

{
  uint uVar1;
  undefined1 *puVar2;
  bool bVar3;
  bool bVar4;
  undefined4 extraout_EAX;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QAbstractTextDocumentLayout *pQVar9;
  QPaintDevice *pQVar10;
  undefined4 extraout_var;
  QTextLayout *this_00;
  QTextLayout *this_01;
  QTextObject *this_02;
  QAbstractTextDocumentLayout *pQVar11;
  undefined8 in_RCX;
  long lVar12;
  void *__child_stack;
  uint uVar13;
  qreal *pqVar14;
  QPointF *pQVar15;
  void *in_R8;
  long in_FS_OFFSET;
  byte bVar16;
  double dVar17;
  double sy;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  QPageRanges pageRanges;
  QPainter p;
  PaintContext ctx;
  QTextDocument *local_168;
  PrivateShared *local_158;
  FormatRange *local_150;
  double local_148;
  QTextDocument *local_138;
  double local_128;
  undefined1 local_118 [8];
  QPainter local_110;
  QMarginsF local_108;
  QFontMetrics local_e0;
  undefined1 local_d8 [12];
  undefined4 uStack_cc;
  undefined1 *local_c8;
  QRectF local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  undefined1 *local_70;
  undefined1 *puStack_68;
  PrivateShared *local_60;
  FormatRange *pFStack_58;
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection> local_50;
  long local_38;
  
  iVar8 = (int)in_RCX;
  bVar16 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (printer != (QPagedPaintDevice *)0x0) {
    lVar12 = *(long *)&this->field_0x8;
    bVar4 = false;
    if ((0.0 <= *(double *)(lVar12 + 0x298)) &&
       (dVar17 = *(double *)(lVar12 + 0x2a0), bVar4 = false, 0.0 <= dVar17)) {
      iVar8 = (int)CONCAT71((int7)((ulong)in_RCX >> 8),NAN(dVar17));
      bVar4 = dVar17 != 2147483647.0 && (*(double *)(lVar12 + 0x298) != 0.0 || dVar17 != 0.0);
    }
    local_108.m_right = -NAN;
    local_108.m_bottom = -NAN;
    local_108.m_left = -NAN;
    local_108.m_top = -NAN;
    QPagedPaintDevice::pageLayout((QPagedPaintDevice *)local_88);
    QPageLayout::margins(&local_108,(QPageLayout *)local_88,Millimeter);
    QPageLayout::~QPageLayout((QPageLayout *)local_88);
    auVar20._4_4_ = -(uint)(local_108.m_top != 0.0);
    auVar20._0_4_ = -(uint)(local_108.m_left != 0.0);
    auVar20._8_4_ = -(uint)(local_108.m_right != 0.0);
    auVar20._12_4_ = -(uint)(local_108.m_bottom != 0.0);
    iVar5 = movmskps(extraout_EAX,auVar20);
    if ((iVar5 == 0) && (!bVar4)) {
      local_108.m_left = 2.0;
      local_108.m_top = 2.0;
      local_108.m_right = 2.0;
      local_108.m_bottom = 2.0;
      (*(printer->super_QPaintDevice)._vptr_QPaintDevice[0xc])(printer,&local_108,0);
    }
    local_110.d_ptr._M_t.
    super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
    super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
         (unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&local_110,&printer->super_QPaintDevice);
    bVar3 = QPainter::isActive(&local_110);
    if (bVar3) {
      documentLayout(this);
      local_158 = *(PrivateShared **)(lVar12 + 0x298);
      local_150 = *(FormatRange **)(lVar12 + 0x2a0);
      iVar5 = qt_defaultDpiX();
      iVar6 = qt_defaultDpiY();
      iVar7 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,7);
      dVar17 = (double)iVar7 / (double)iVar5;
      iVar7 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,8);
      sy = (double)iVar7 / (double)iVar6;
      if (bVar4) {
        pQVar9 = (QAbstractTextDocumentLayout *)documentLayout(this);
        pQVar10 = QAbstractTextDocumentLayout::paintDevice(pQVar9);
        if (pQVar10 != (QPaintDevice *)0x0) {
          (*pQVar10->_vptr_QPaintDevice[4])(pQVar10,7);
          (*pQVar10->_vptr_QPaintDevice[4])(pQVar10,8);
        }
        QPainter::scale(&local_110,dVar17,sy);
        dVar18 = *(double *)(lVar12 + 0x298);
        dVar19 = *(double *)(lVar12 + 0x2a0);
        iVar8 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,1);
        iVar5 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,2);
        QPainter::scale(&local_110,(double)iVar8 / (dVar17 * dVar18),(double)iVar5 / (sy * dVar19));
        local_128 = 0.0;
        local_138 = (QTextDocument *)0x0;
        local_148 = 0.0;
        local_168 = this;
      }
      else {
        iVar8 = clone(this,(__fn *)this,__child_stack,iVar8,in_R8);
        local_168 = (QTextDocument *)CONCAT44(extraout_var,iVar8);
        local_b8.xp = *(qreal *)&this->field_0x8;
        uVar1 = *(uint *)*(_func_int **)((long)local_b8.xp + 0x160);
        do {
          uVar13 = uVar1;
          if (uVar13 == 0) break;
          uVar1 = *(uint *)(*(_func_int **)((long)local_b8.xp + 0x160) +
                           ((ulong)uVar13 * 0x12 + 1) * 4);
        } while (uVar1 != 0);
        local_b8.yp = (qreal)CONCAT44(0xaaaaaaaa,uVar13);
        local_d8._0_8_ = *(undefined8 *)&local_168->field_0x8;
        uVar1 = **(uint **)(local_d8._0_8_ + 0x160);
        do {
          uVar13 = uVar1;
          if (uVar13 == 0) break;
          uVar1 = (*(uint **)(local_d8._0_8_ + 0x160))[(ulong)uVar13 * 0x12 + 1];
        } while (uVar1 != 0);
        stack0xffffffffffffff30 = (undefined1 *)CONCAT44(0xaaaaaaaa,uVar13);
        bVar4 = QTextBlock::isValid((QTextBlock *)&local_b8);
        if (bVar4) {
          do {
            bVar4 = QTextBlock::isValid((QTextBlock *)local_d8);
            if (!bVar4) break;
            this_00 = QTextBlock::layout((QTextBlock *)local_d8);
            this_01 = QTextBlock::layout((QTextBlock *)&local_b8);
            QTextLayout::formats((QList<QTextLayout::FormatRange> *)local_88,this_01);
            QTextLayout::setFormats(this_00,(QList<QTextLayout::FormatRange> *)local_88);
            QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
                      ((QArrayDataPointer<QTextLayout::FormatRange> *)local_88);
            QTextBlock::next((QTextBlock *)local_88);
            local_b8.xp = (qreal)local_88._0_8_;
            local_b8.yp = (qreal)CONCAT44(local_b8.yp._4_4_,local_88._8_4_);
            QTextBlock::next((QTextBlock *)local_98);
            local_d8._0_8_ = local_98._0_8_;
            stack0xffffffffffffff30 = (undefined1 *)CONCAT44(uStack_cc,local_98._8_4_);
            bVar4 = QTextBlock::isValid((QTextBlock *)&local_b8);
          } while (bVar4);
        }
        pQVar9 = (QAbstractTextDocumentLayout *)documentLayout(local_168);
        pQVar10 = QPainter::device(&local_110);
        QAbstractTextDocumentLayout::setPaintDevice(pQVar9,pQVar10);
        pQVar11 = documentLayout(this);
        QHash<int,_QTextObjectHandler>::operator=
                  ((QHash<int,_QTextObjectHandler> *)(*(long *)(pQVar9 + 8) + 0x78),
                   (QHash<int,_QTextObjectHandler> *)(*(long *)&pQVar11->field_0x8 + 0x78));
        local_b8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QTextDocumentPrivate::rootFrame(*(QTextDocumentPrivate **)&local_168->field_0x8);
        QTextFrame::frameFormat((QTextFrame *)&local_b8);
        dVar18 = (double)(int)((double)iVar5 * 0.7874015748031495);
        ::QVariant::QVariant((QVariant *)local_88,dVar18);
        QTextFormat::setProperty((QTextFormat *)&local_b8,0x4007,(QVariant *)local_88);
        ::QVariant::~QVariant((QVariant *)local_88);
        ::QVariant::QVariant((QVariant *)local_88,dVar18);
        QTextFormat::setProperty((QTextFormat *)&local_b8,0x4008,(QVariant *)local_88);
        ::QVariant::~QVariant((QVariant *)local_88);
        dVar19 = (double)(int)((double)iVar6 * 0.7874015748031495);
        ::QVariant::QVariant((QVariant *)local_88,dVar19);
        QTextFormat::setProperty((QTextFormat *)&local_b8,0x4005,(QVariant *)local_88);
        ::QVariant::~QVariant((QVariant *)local_88);
        ::QVariant::QVariant((QVariant *)local_88,dVar19);
        QTextFormat::setProperty((QTextFormat *)&local_b8,0x4006,(QVariant *)local_88);
        ::QVariant::~QVariant((QVariant *)local_88);
        this_02 = &QTextDocumentPrivate::rootFrame(*(QTextDocumentPrivate **)&local_168->field_0x8)
                   ->super_QTextObject;
        QTextObject::setFormat(this_02,(QTextFormat *)&local_b8);
        pQVar10 = QPainter::device(&local_110);
        iVar8 = (*pQVar10->_vptr_QPaintDevice[4])(pQVar10,8);
        iVar5 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,1);
        local_158 = (PrivateShared *)(double)iVar5;
        iVar5 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,2);
        local_150 = (FormatRange *)(double)iVar5;
        local_148 = (double)local_158 - dVar17 * dVar18;
        QFont::QFont((QFont *)local_88,(QFont *)(*(long *)&local_168->field_0x8 + 0x128));
        pQVar10 = QPainter::device(&local_110);
        QFontMetrics::QFontMetrics((QFontMetrics *)local_d8,(QFont *)local_88,pQVar10);
        iVar5 = QFontMetrics::ascent((QFontMetrics *)local_d8);
        local_128 = (double)(iVar8 * 5) / 72.0 + (double)iVar5 + ((double)local_150 - sy * dVar19);
        QFontMetrics::~QFontMetrics((QFontMetrics *)local_d8);
        QFont::~QFont((QFont *)local_88);
        local_88._0_8_ = local_158;
        local_88._8_8_ = local_150;
        setPageSize(local_168,(QSizeF *)local_88);
        QTextFormat::~QTextFormat((QTextFormat *)&local_b8);
        local_138 = local_168;
      }
      local_118 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      QPagedPaintDevice::pageRanges((QPagedPaintDevice *)local_118);
      iVar5 = QPageRanges::firstPage((QPageRanges *)local_118);
      iVar8 = QPageRanges::lastPage((QPageRanges *)local_118);
      if (iVar8 == 0 && iVar5 == 0) {
        pQVar11 = documentLayout(local_168);
        iVar8 = (**(code **)(*(long *)pQVar11 + 0x70))(pQVar11);
        iVar5 = 1;
      }
      iVar6 = 1;
      if (1 < iVar5) {
        iVar6 = iVar5;
      }
      pQVar11 = documentLayout(local_168);
      iVar5 = (**(code **)(*(long *)pQVar11 + 0x70))(pQVar11);
      if (iVar5 < iVar8) {
        iVar8 = iVar5;
      }
      if (iVar6 <= iVar8) {
        do {
          bVar4 = QPageRanges::isEmpty((QPageRanges *)local_118);
          if ((bVar4) || (bVar4 = QPageRanges::contains((QPageRanges *)local_118,iVar6), bVar4)) {
            QPainter::save(&local_110);
            puVar2 = (undefined1 *)((double)(iVar6 + -1) * (double)local_150);
            local_88._8_8_ = 0.0 - (double)puVar2;
            local_88._0_8_ = (PrivateShared *)0x0;
            QPainter::translate(&local_110,(QPointF *)local_88);
            local_b8.xp = 0.0;
            local_b8.w = (qreal)local_158;
            local_b8.h = (qreal)local_150;
            local_b8.yp = (qreal)puVar2;
            pQVar11 = documentLayout(local_168);
            pqVar14 = (qreal *)&DAT_006bb8d8;
            pQVar15 = (QPointF *)local_88;
            for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
              pQVar15->xp = *pqVar14;
              pqVar14 = pqVar14 + (ulong)bVar16 * -2 + 1;
              pQVar15 = (QPointF *)&pQVar15[-(ulong)bVar16].yp;
            }
            local_88._0_4_ = 0xffffffff;
            QPalette::QPalette((QPalette *)(local_88 + 8));
            local_50.size = 0;
            local_50.d = (Data *)0x0;
            local_50.ptr = (Selection *)0x0;
            local_60 = (PrivateShared *)0x0;
            pFStack_58 = (FormatRange *)0x0;
            local_70 = (undefined1 *)0x0;
            puStack_68 = (undefined1 *)0x0;
            QPainter::setClipRect(&local_110,&local_b8,ReplaceClip);
            local_60 = (PrivateShared *)local_b8.w;
            pFStack_58 = (FormatRange *)local_b8.h;
            local_70 = (undefined1 *)local_b8.xp;
            puStack_68 = (undefined1 *)local_b8.yp;
            QColor::QColor((QColor *)local_d8,black);
            QBrush::QBrush((QBrush *)local_98,(QColor *)local_d8,SolidPattern);
            QPalette::setBrush((QPalette *)(local_88 + 8),All,Text,(QBrush *)local_98);
            QBrush::~QBrush((QBrush *)local_98);
            (**(code **)(*(long *)pQVar11 + 0x60))(pQVar11,&local_110,local_88);
            if (local_128 != 0.0 || local_148 != 0.0) {
              QPainter::setClipping(&local_110,false);
              QFont::QFont((QFont *)local_d8,(QFont *)(*(long *)&local_168->field_0x8 + 0x128));
              QPainter::setFont(&local_110,(QFont *)local_d8);
              QFont::~QFont((QFont *)local_d8);
              local_c8 = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              stack0xffffffffffffff30 = &DAT_aaaaaaaaaaaaaaaa;
              QString::number((int)(QFont *)local_d8,iVar6);
              QPainter::fontMetrics((QPainter *)&local_e0);
              iVar5 = QFontMetrics::horizontalAdvance(&local_e0,(QString *)local_d8,-1);
              local_98._0_8_ =
                   (undefined8)
                   (int)((double)((ulong)(local_148 - (double)iVar5) & 0x8000000000000000 |
                                 0x3fe0000000000000) + (local_148 - (double)iVar5));
              local_98._8_8_ =
                   (undefined8)
                   (int)((double)((ulong)(local_b8.yp + local_128) & 0x8000000000000000 |
                                 0x3fe0000000000000) + local_b8.yp + local_128);
              QPainter::drawText(&local_110,(QPointF *)local_98,(QString *)local_d8);
              QFontMetrics::~QFontMetrics(&local_e0);
              if ((totally_ordered_wrapper<QFontPrivate_*>)local_d8._0_8_ !=
                  (totally_ordered_wrapper<QFontPrivate_*>)0x0) {
                LOCK();
                *(int *)local_d8._0_8_ = *(int *)local_d8._0_8_ + -1;
                UNLOCK();
                if (*(int *)local_d8._0_8_ == 0) {
                  QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                }
              }
            }
            QPainter::restore(&local_110);
            QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer(&local_50)
            ;
            QPalette::~QPalette((QPalette *)(local_88 + 8));
          }
          if (iVar8 == iVar6) break;
          iVar6 = iVar6 + 1;
          iVar5 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[8])();
        } while ((char)iVar5 != '\0');
      }
      QPageRanges::~QPageRanges((QPageRanges *)local_118);
      if (local_138 != (QTextDocument *)0x0) {
        (**(code **)(*(long *)local_138 + 0x20))();
      }
    }
    QPainter::~QPainter(&local_110);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocument::print(QPagedPaintDevice *printer) const
{
    Q_D(const QTextDocument);

    if (!printer)
        return;

    bool documentPaginated = d->pageSize.isValid() && !d->pageSize.isNull()
                             && d->pageSize.height() != INT_MAX;

    // ### set page size to paginated size?
    QMarginsF m = printer->pageLayout().margins(QPageLayout::Millimeter);
    if (!documentPaginated && m.left() == 0. && m.right() == 0. && m.top() == 0. && m.bottom() == 0.) {
        m.setLeft(2);
        m.setRight(2);
        m.setTop(2);
        m.setBottom(2);
        printer->setPageMargins(m, QPageLayout::Millimeter);
    }
    // ### use the margins correctly

    QPainter p(printer);

    // Check that there is a valid device to print to.
    if (!p.isActive())
        return;

    const QTextDocument *doc = this;
    QScopedPointer<QTextDocument> clonedDoc;
    (void)doc->documentLayout(); // make sure that there is a layout

    QRectF body = QRectF(QPointF(0, 0), d->pageSize);
    QPointF pageNumberPos;

    qreal sourceDpiX = qt_defaultDpiX();
    qreal sourceDpiY = qt_defaultDpiY();
    const qreal dpiScaleX = qreal(printer->logicalDpiX()) / sourceDpiX;
    const qreal dpiScaleY = qreal(printer->logicalDpiY()) / sourceDpiY;

    if (documentPaginated) {

        QPaintDevice *dev = doc->documentLayout()->paintDevice();
        if (dev) {
            sourceDpiX = dev->logicalDpiX();
            sourceDpiY = dev->logicalDpiY();
        }

        // scale to dpi
        p.scale(dpiScaleX, dpiScaleY);

        QSizeF scaledPageSize = d->pageSize;
        scaledPageSize.rwidth() *= dpiScaleX;
        scaledPageSize.rheight() *= dpiScaleY;

        const QSizeF printerPageSize(printer->width(), printer->height());

        // scale to page
        p.scale(printerPageSize.width() / scaledPageSize.width(),
                printerPageSize.height() / scaledPageSize.height());
    } else {
        doc = clone(const_cast<QTextDocument *>(this));
        clonedDoc.reset(const_cast<QTextDocument *>(doc));

        for (QTextBlock srcBlock = firstBlock(), dstBlock = clonedDoc->firstBlock();
             srcBlock.isValid() && dstBlock.isValid();
             srcBlock = srcBlock.next(), dstBlock = dstBlock.next()) {
            dstBlock.layout()->setFormats(srcBlock.layout()->formats());
        }

        QAbstractTextDocumentLayout *layout = doc->documentLayout();
        layout->setPaintDevice(p.device());

        // copy the custom object handlers
        layout->d_func()->handlers = documentLayout()->d_func()->handlers;

        // 2 cm margins, scaled to device in QTextDocumentLayoutPrivate::layoutFrame
        const int horizontalMargin = int((2/2.54)*sourceDpiX);
        const int verticalMargin = int((2/2.54)*sourceDpiY);
        QTextFrameFormat fmt = doc->rootFrame()->frameFormat();
        fmt.setLeftMargin(horizontalMargin);
        fmt.setRightMargin(horizontalMargin);
        fmt.setTopMargin(verticalMargin);
        fmt.setBottomMargin(verticalMargin);
        doc->rootFrame()->setFrameFormat(fmt);

        // pageNumberPos must be in device coordinates, so scale to device here
        const int dpiy = p.device()->logicalDpiY();
        body = QRectF(0, 0, printer->width(), printer->height());
        pageNumberPos = QPointF(body.width() - horizontalMargin * dpiScaleX,
                                body.height() - verticalMargin * dpiScaleY
                                + QFontMetrics(doc->defaultFont(), p.device()).ascent()
                                + 5 * dpiy / 72.0);
        clonedDoc->setPageSize(body.size());
    }

    const QPageRanges pageRanges = printer->pageRanges();
    int fromPage = pageRanges.firstPage();
    int toPage = pageRanges.lastPage();

    if (fromPage == 0 && toPage == 0) {
        fromPage = 1;
        toPage = doc->pageCount();
    }
    // paranoia check
    fromPage = qMax(1, fromPage);
    toPage = qMin(doc->pageCount(), toPage);

    if (toPage < fromPage) {
        // if the user entered a page range outside the actual number
        // of printable pages, just return
        return;
    }

//    bool ascending = true;
//    if (printer->pageOrder() == QPrinter::LastPageFirst) {
//        int tmp = fromPage;
//        fromPage = toPage;
//        toPage = tmp;
//        ascending = false;
//    }

    int page = fromPage;
    while (true) {
        if (pageRanges.isEmpty() || pageRanges.contains(page))
            printPage(page, &p, doc, body, pageNumberPos);

        if (page == toPage)
            break;
        ++page;
        if (!printer->newPage())
            return;
    }
}